

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char *local_30;
  char *passphrase;
  char *certname;
  char **password_local;
  char **file_local;
  char *nextarg_local;
  
  if (nextarg != (char *)0x0) {
    certname = (char *)password;
    password_local = file;
    file_local = (char **)nextarg;
    parse_cert_parameter(nextarg,&passphrase,&local_30);
    free(*password_local);
    *password_local = passphrase;
    if (local_30 != (char *)0x0) {
      free(*(void **)certname);
      *(char **)certname = local_30;
    }
  }
  return;
}

Assistant:

static void
GetFileAndPassword(const char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  if(nextarg) {
    parse_cert_parameter(nextarg, &certname, &passphrase);
    free(*file);
    *file = certname;
    if(passphrase) {
      free(*password);
      *password = passphrase;
    }
  }
}